

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

bool __thiscall
ExecutionEngine::doesMethodExist
          (ExecutionEngine *this,ClassRuntime *classRuntime,string *name,string *descriptor)

{
  u2 index;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ClassFile *pCVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  string methodName;
  string methodDesc;
  allocator local_79;
  string *local_78;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_78 = descriptor;
  pCVar4 = ClassRuntime::getClassFile(classRuntime);
  if (pCVar4->methods_count == 0) {
    bVar2 = false;
  }
  else {
    lVar7 = 4;
    uVar6 = 0;
    bVar2 = false;
    do {
      index = *(u2 *)((long)&pCVar4->methods->access_flags + lVar7);
      pcVar5 = getFormattedConstant
                         (pCVar4->constant_pool,*(u2 *)((long)pCVar4->methods + lVar7 + -2));
      std::__cxx11::string::string((string *)&local_70,pcVar5,(allocator *)&local_50);
      pcVar5 = getFormattedConstant(pCVar4->constant_pool,index);
      std::__cxx11::string::string((string *)&local_50,pcVar5,&local_79);
      if (((local_68 == name->_M_string_length) &&
          (((local_68 == 0 || (iVar3 = bcmp(local_70,(name->_M_dataplus)._M_p,local_68), iVar3 == 0)
            ) && (local_48 == local_78->_M_string_length)))) &&
         ((local_48 == 0 ||
          (iVar3 = bcmp(local_50,(local_78->_M_dataplus)._M_p,local_48), iVar3 == 0)))) {
        bVar1 = false;
        bVar2 = true;
      }
      else {
        bVar1 = true;
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (!bVar1) {
        return bVar2;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < pCVar4->methods_count);
  }
  return bVar2;
}

Assistant:

bool ExecutionEngine::doesMethodExist(ClassRuntime *classRuntime, string name, string descriptor) {
    ClassFile *classFile = classRuntime->getClassFile();

    bool found = false;
    method_info method;
    for (int i = 0; i < classFile->methods_count; i++) {
        method = classFile->methods[i];
        string methodName = getFormattedConstant(classFile->constant_pool, method.name_index);
        string methodDesc = getFormattedConstant(classFile->constant_pool, method.descriptor_index);

        if (methodName == name && methodDesc == descriptor) {
            found = true;
            break;
        }
    }

    return found;
}